

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
kratos::get_target_var_name_abi_cxx11_
          (optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,kratos *this,Var *var)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  char *pcVar7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> scope_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> var_name;
  
  plVar6 = *(long **)(this + 0x50);
  plVar4 = *(long **)(this + 0x58);
  while( true ) {
    if (plVar6 == plVar4) {
      (__return_storage_ptr__->
      super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_engaged = false;
      return __return_storage_ptr__;
    }
    pcVar7 = (char *)(*plVar6 + 0x28);
    lVar5 = std::__cxx11::string::rfind(pcVar7,0x250273,0xffffffffffffffff);
    if (lVar5 == 0) break;
    plVar6 = plVar6 + 2;
  }
  std::__cxx11::string::rfind((char)pcVar7,0x3a);
  std::__cxx11::string::substr((ulong)local_70,(ulong)pcVar7);
  std::__cxx11::string::substr((ulong)((long)&scope_name.field_2 + 8),(ulong)pcVar7);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&scope_name.field_2 + 8));
  paVar1 = &(__return_storage_ptr__->
            super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_payload._M_value.first.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&(__return_storage_ptr__->
        super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_payload = paVar1;
  paVar3 = &local_b0.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.first._M_dataplus._M_p == paVar3) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_b0.first.field_2._M_allocated_capacity._1_7_,
                  local_b0.first.field_2._M_local_buf[0]);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_payload._M_value.first.field_2 + 8) = local_b0.first.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload._M_value.first._M_dataplus = (_Alloc_hider)local_b0.first._M_dataplus._M_p;
    (__return_storage_ptr__->
    super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload._M_value.first.field_2._M_allocated_capacity =
         CONCAT71(local_b0.first.field_2._M_allocated_capacity._1_7_,
                  local_b0.first.field_2._M_local_buf[0]);
  }
  paVar1 = &local_b0.second.field_2;
  (__return_storage_ptr__->
  super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_payload._M_value.first._M_string_length = local_b0.first._M_string_length;
  paVar2 = &(__return_storage_ptr__->
            super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_payload._M_value.second.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&(__return_storage_ptr__->
               super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_payload + 0x20) = paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.second._M_dataplus._M_p == paVar1) {
    paVar2->_M_allocated_capacity =
         CONCAT71(local_b0.second.field_2._M_allocated_capacity._1_7_,
                  local_b0.second.field_2._M_local_buf[0]);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_payload._M_value.second.field_2 + 8) = local_b0.second.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload._M_value.second._M_dataplus._M_p = local_b0.second._M_dataplus._M_p;
    (__return_storage_ptr__->
    super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload._M_value.second.field_2._M_allocated_capacity =
         CONCAT71(local_b0.second.field_2._M_allocated_capacity._1_7_,
                  local_b0.second.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->
  super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_payload._M_value.second._M_string_length = local_b0.second._M_string_length;
  (__return_storage_ptr__->
  super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_engaged = true;
  local_b0.second.field_2._M_local_buf[0] = '\0';
  local_b0.second._M_string_length = 0;
  local_b0.first.field_2._M_local_buf[0] = '\0';
  local_b0.first._M_string_length = 0;
  local_b0.first._M_dataplus._M_p = (pointer)paVar3;
  local_b0.second._M_dataplus._M_p = (pointer)paVar1;
  if ((size_type *)scope_name.field_2._8_8_ != &var_name._M_string_length) {
    operator_delete((void *)scope_name.field_2._8_8_,var_name._M_string_length + 1);
  }
  if (local_70 == (undefined1  [8])&scope_name._M_string_length) {
    return __return_storage_ptr__;
  }
  operator_delete((void *)local_70,scope_name._M_string_length + 1);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::pair<std::string, std::string>> get_target_var_name(const Var *var) {
    auto const &attrs = var->get_attributes();
    for (auto const &attr : attrs) {
        auto const &value_str = attr->value_str;
        if (value_str.rfind("ssa=") == 0) {
            auto pos = value_str.rfind(':');
            auto scope_name = value_str.substr(4, pos - 4);
            auto var_name = value_str.substr(pos + 1);
            return std::make_pair(scope_name, var_name);
        }
    }
    return std::nullopt;
}